

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O2

void tommy_hashlin_insert
               (tommy_hashlin *hashlin,tommy_hashlin_node *node,void *data,tommy_hash_t hash)

{
  uint uVar1;
  tommy_node_struct *ptVar2;
  tommy_node_struct *ptVar3;
  uint uVar4;
  uint uVar5;
  tommy_count_t tVar6;
  tommy_hashlin_node **pptVar7;
  void *pvVar8;
  tommy_uint_t tVar9;
  uint uVar10;
  uint uVar11;
  tommy_hashlin_node *ptVar12;
  tommy_node_struct *ptVar13;
  long in_FS_OFFSET;
  tommy_hashlin_node **local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pptVar7 = tommy_hashlin_bucket_ref(hashlin,hash);
  tommy_list_insert_tail(pptVar7,node,data);
  node->key = hash;
  uVar5 = hashlin->count + 1;
  hashlin->count = uVar5;
  if (hashlin->state != 1) {
    uVar1 = hashlin->bucket_max;
    if (uVar5 <= uVar1 >> 1) goto LAB_00110065;
    if (hashlin->state == 0) {
      hashlin->low_max = uVar1;
      hashlin->low_mask = hashlin->bucket_mask;
      pvVar8 = lrtr_malloc((ulong)uVar1 * 8);
      uVar5 = hashlin->bucket_bit;
      hashlin->bucket[uVar5] = (tommy_hashlin_node **)((long)pvVar8 + (ulong)hashlin->low_max * -8);
      tVar9 = uVar5 + 1;
      tVar6 = 1 << ((byte)tVar9 & 0x1f);
      hashlin->bucket_bit = tVar9;
      hashlin->bucket_max = tVar6;
      hashlin->bucket_mask = tVar6 - 1;
      hashlin->split = 0;
      uVar5 = hashlin->count;
    }
    hashlin->state = 1;
  }
  uVar1 = hashlin->low_max;
  uVar10 = hashlin->split;
  do {
    uVar11 = uVar10 + uVar1;
    if (uVar5 * 2 <= uVar11) goto LAB_00110065;
    uVar4 = 0x1f;
    if ((uVar10 | 1) != 0) {
      for (; (uVar10 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    local_38[0] = hashlin->bucket[uVar4] + uVar10;
    uVar4 = 0x1f;
    if ((uVar11 | 1) != 0) {
      for (; (uVar11 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    pptVar7 = hashlin->bucket[uVar4];
    local_38[1] = pptVar7 + uVar11;
    ptVar12 = *local_38[0];
    *local_38[0] = (tommy_hashlin_node *)0x0;
    pptVar7[uVar11] = (tommy_hashlin_node *)0x0;
    while (ptVar12 != (tommy_hashlin_node *)0x0) {
      ptVar2 = ptVar12->next;
      ptVar13 = (tommy_node_struct *)local_38[(ptVar12->key & uVar1) != 0];
      ptVar3 = ptVar13->next;
      if (ptVar3 == (tommy_node_struct *)0x0) {
        ptVar12->prev = ptVar12;
      }
      else {
        ptVar12->prev = ptVar3->prev;
        ptVar3->prev = ptVar12;
        ptVar13 = ptVar12->prev;
      }
      ptVar12->next = (tommy_node_struct *)0x0;
      ptVar13->next = ptVar12;
      ptVar12 = ptVar2;
    }
    uVar10 = uVar10 + 1;
    hashlin->split = uVar10;
  } while (uVar10 != uVar1);
  hashlin->state = 0;
  hashlin->low_max = hashlin->bucket_max;
  hashlin->low_mask = hashlin->bucket_mask;
  hashlin->split = 0;
LAB_00110065:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashlin_insert(tommy_hashlin* hashlin, tommy_hashlin_node* node, void* data, tommy_hash_t hash)
{
	tommy_list_insert_tail(tommy_hashlin_bucket_ref(hashlin, hash), node, data);

	node->key = hash;

	++hashlin->count;

	hashlin_grow_step(hashlin);
}